

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe_tests.cc
# Opt level: O3

bool lf::uscalfe::test::scalarFEInterpTest<double>(ScalarReferenceFiniteElement<double> *fe_desc)

{
  size_type cols;
  Scalar SVar1;
  Matrix<double,_1,__1,_1,_1,__1> *lhs;
  double *pdVar2;
  Index IVar3;
  int iVar4;
  undefined8 *puVar5;
  ActualDstType actualDst;
  char *pcVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  RowVectorXd rand_vals;
  size_type N_rsf;
  size_type N_evln;
  RowVectorXd nodvals;
  Matrix<double,__1,__1,_0,__1,__1> rsf_at_evln;
  Matrix<double,_1,__1,_1,_1,__1> coeffs;
  MatrixXd evl_nodes;
  Matrix<double,_1,__1,_1,_1,__1> local_e8;
  scalar_sum_op<double,_double> local_d1;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
  local_d0;
  undefined1 local_b8 [8];
  variable_if_dynamic<long,__1> local_b0;
  RhsNested pMStack_a8;
  uint local_90;
  uint local_8c;
  PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> local_88;
  Rhs local_70;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  Lhs local_48;
  void *local_38 [2];
  double *local_28;
  
  (*fe_desc->_vptr_ScalarReferenceFiniteElement[9])(local_38,fe_desc);
  local_8c = (*fe_desc->_vptr_ScalarReferenceFiniteElement[10])(fe_desc);
  local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_28;
  testing::internal::CmpHelperEQ<long,unsigned_int>
            ((internal *)local_b8,"evl_nodes.cols()","N_evln",(long *)&local_70,&local_8c);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_data + 2),"No. evl nodes mismatch",0x16);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_b0.m_value;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/lagr_fe_tests.cc"
               ,0x76,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        != (double *)0x0) {
      (**(code **)((long)*local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_data + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0.m_value !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b0.m_value);
  }
  local_90 = (*fe_desc->_vptr_ScalarReferenceFiniteElement[4])(fe_desc);
  (*fe_desc->_vptr_ScalarReferenceFiniteElement[7])(&local_70,fe_desc,local_38);
  local_d0.m_lhs =
       (LhsNested)
       local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  testing::internal::CmpHelperEQ<long,unsigned_int>
            ((internal *)local_b8,"rsf_at_evln.rows()","N_rsf",(long *)&local_d0,&local_90);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_d0.m_lhs + 1),"No. rsf mismatch",0x10);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_b0.m_value;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/lagr_fe_tests.cc"
               ,0x7b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if (local_d0.m_lhs != (LhsNested)0x0) {
      (*(code *)((local_d0.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                m_storage.m_data[1])();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0.m_value !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b0.m_value);
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_b8,"N_evln","N_rsf",&local_8c,&local_90);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_d0.m_lhs + 1),"Nos of rsf and evaluation nodes must agree",0x2a);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_b0.m_value;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/lagr_fe_tests.cc"
               ,0x7f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if (local_d0.m_lhs != (LhsNested)0x0) {
      (*(code *)((local_d0.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                m_storage.m_data[1])();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0.m_value !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b0.m_value);
  }
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                    *)local_b8,1,(ulong)local_8c,(scalar_random_op<double> *)&local_d0);
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = 0;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>,double,double>
            (&local_e8,
             (CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
              *)local_b8,(assign_op<double,_double> *)&local_d0);
  IVar3 = local_e8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols;
  pdVar2 = local_e8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data;
  if (0 < local_e8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols)
  {
    lVar7 = 0;
    do {
      iVar4 = rand();
      pdVar2[lVar7] = ((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0;
      lVar7 = lVar7 + 1;
    } while (IVar3 != lVar7);
  }
  (*fe_desc->_vptr_ScalarReferenceFiniteElement[0xb])(&local_48,fe_desc,&local_e8);
  Eigen::
  Product<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
  Product((Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
           *)local_b8,&local_48,&local_70);
  lhs = (Matrix<double,_1,__1,_1,_1,__1> *)CONCAT71(local_b8._1_7_,local_b8[0]);
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_cols = 0;
  cols = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_b0.m_value + 0x10))->_M_allocated_capacity;
  if ((cols != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)cols),0) < 1)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = execv;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize(&local_88,1,cols);
  if (local_88.m_storage.m_cols !=
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_b0.m_value + 0x10))->_M_allocated_capacity) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              (&local_88,1,
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_b0.m_value + 0x10))->_M_allocated_capacity);
  }
  Eigen::internal::
  generic_product_impl_base<Eigen::Matrix<double,1,-1,1,1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,1,-1,1,1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>>
  ::evalTo<Eigen::Matrix<double,1,_1,1,1,_1>>
            ((Matrix<double,_1,__1,_1,_1,__1> *)&local_88,lhs,
             (Matrix<double,__1,__1,_0,__1,__1> *)local_b0.m_value);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp(&local_d0,(Lhs *)&local_88,&local_e8,
                  (scalar_difference_op<double,_double> *)local_b8);
  local_b0.m_value = (long)local_d0.m_lhs;
  pMStack_a8 = local_d0.m_rhs;
  if (((local_d0.m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
      m_cols == 0) {
    uVar8 = 0;
    uVar9 = 0;
  }
  else {
    SVar1 = Eigen::
            DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,-1,1,1,-1>const,Eigen::Matrix<double,1,-1,1,1,-1>const>const>>
            ::redux<Eigen::internal::scalar_sum_op<double,double>>
                      ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,_1,1,1,_1>const,Eigen::Matrix<double,1,_1,1,1,_1>const>const>>
                        *)local_b8,&local_d1);
    uVar8 = SUB84(SVar1,0);
    uVar9 = (undefined4)((ulong)SVar1 >> 0x20);
  }
  testing::internal::DoubleNearPredFormat
            (local_58,"(nodvals - rand_vals).norm()","0.0","1e-13",
             SQRT((double)CONCAT44(uVar9,uVar8)),0.0,1e-13);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT71(local_b8._1_7_,local_b8[0]) + 0x10),"Value mismatch",0xe);
    Eigen::operator<<((ostream *)(CONCAT71(local_b8._1_7_,local_b8[0]) + 0x10),
                      (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT71(local_b8._1_7_,local_b8[0]) + 0x10)," <-> ",5);
    Eigen::operator<<((ostream *)(CONCAT71(local_b8._1_7_,local_b8[0]) + 0x10),
                      (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&local_e8);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/lagr_fe_tests.cc"
               ,0x8b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((long *)CONCAT71(local_b8._1_7_,local_b8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_b8._1_7_,local_b8[0]) + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  free(local_88.m_storage.m_data);
  free(local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
  free(local_e8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
  free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_38[0]);
  return true;
}

Assistant:

bool scalarFEInterpTest(
    const lf::fe::ScalarReferenceFiniteElement<SCALAR> &fe_desc) {
  // Interpolates random values at interpolation nodes
  // and checks whether the resulting linear combination of
  // basis functions reproduces those values

  // Fetch evaluation nodes
  const Eigen::MatrixXd evl_nodes{fe_desc.EvaluationNodes()};
  const size_type N_evln = fe_desc.NumEvaluationNodes();
  EXPECT_EQ(evl_nodes.cols(), N_evln) << "No. evl nodes mismatch";

  // Evaluate reference shape functions in evaluation nodes
  const size_type N_rsf = fe_desc.NumRefShapeFunctions();
  auto rsf_at_evln = fe_desc.EvalReferenceShapeFunctions(evl_nodes);
  EXPECT_EQ(rsf_at_evln.rows(), N_rsf) << "No. rsf mismatch";

  // Test makes sense only, if the number of local shape functions
  // agrees with the number of evaluation nodes
  EXPECT_EQ(N_evln, N_rsf) << "Nos of rsf and evaluation nodes must agree";

  // Vector of random nodal values
  Eigen::RowVectorXd rand_vals{Eigen::RowVectorXd::Random(N_evln)};
  // Obtain corresponding linear combination of shape functions
  Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> coeffs{
      fe_desc.NodalValuesToDofs(rand_vals)};

  // Evaluate linear combination of basis functions at evaluation nodes
  Eigen::RowVectorXd nodvals = coeffs * rsf_at_evln;

  // Check agreement of values
  EXPECT_NEAR((nodvals - rand_vals).norm(), 0.0, 1e-13)
      << "Value mismatch" << nodvals << " <-> " << rand_vals;
  return true;
}